

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

string * __thiscall
glcts::AdvancedUsageSwitchPrograms::GenFSSrc_abi_cxx11_
          (string *__return_storage_ptr__,AdvancedUsageSwitchPrograms *this,int binding,int offset)

{
  ostream *poVar1;
  ostringstream os;
  ostream oStack_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_198);
  poVar1 = std::operator<<(&oStack_198,
                           "#version 310 es\nlayout(location = 0) out uvec4 o_color;\nlayout(binding = "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,binding);
  poVar1 = std::operator<<(poVar1,", offset = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,offset);
  std::operator<<(poVar1,
                  ") uniform atomic_uint ac_counter_fs;\nvoid main() {\n  o_color = uvec4(atomicCounterIncrement(ac_counter_fs));\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GenFSSrc(int binding, int offset)
	{
		std::ostringstream os;
		os << "#version 310 es" NL "layout(location = 0) out uvec4 o_color;" NL "layout(binding = " << binding
		   << ", offset = " << offset << ") uniform atomic_uint ac_counter_fs;" NL "void main() {" NL
										 "  o_color = uvec4(atomicCounterIncrement(ac_counter_fs));" NL "}";
		return os.str();
	}